

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildElementU
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot instance,
          PropertyIdIndexType propertyIdIndex)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  PropertyId propertyId;
  RegSlot RVar4;
  JITTimeFunctionBody *pJVar5;
  ByteCodeUsesInstr *this_00;
  SymOpnd *pSVar6;
  SymOpnd *dstOpnd;
  Instr *instr;
  RegOpnd *this_01;
  IntConstOpnd *this_02;
  undefined4 *puVar7;
  Func *pFVar8;
  int iVar9;
  undefined6 in_register_00000032;
  OpCode opcode;
  
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  propertyId = JITTimeFunctionBody::GetReferencedPropertyId(pJVar5,propertyIdIndex);
  iVar9 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (iVar9 < 0x130) {
    if (iVar9 == 0xbf) {
      dstOpnd = BuildFieldOpnd(this,LdElemUndefScoped,instance,propertyId,propertyIdIndex,
                               PropertyKindData,0xffffffff);
      pSVar6 = (SymOpnd *)BuildSrcOpnd(this,1,TyVar);
      pFVar8 = this->m_func;
      opcode = LdElemUndefScoped;
    }
    else {
      if (iVar9 != 0xc3) {
        if (iVar9 != 0x12f) {
LAB_004d9c58:
          pSVar6 = BuildFieldOpnd(this,newOpcode,instance,propertyId,propertyIdIndex,
                                  PropertyKindData,0xffffffff);
          pFVar8 = this->m_func;
          goto LAB_004d9c7e;
        }
        bVar2 = false;
        goto LAB_004d9bf6;
      }
      pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar4 = JITTimeFunctionBody::GetLocalClosureReg(pJVar5);
      dstOpnd = BuildFieldOpnd(this,StLocalFuncExpr,RVar4,propertyId,propertyIdIndex,
                               PropertyKindData,0xffffffff);
      pSVar6 = (SymOpnd *)BuildSrcOpnd(this,instance,TyVar);
      pFVar8 = this->m_func;
      opcode = StFuncExpr;
    }
  }
  else {
    if (iVar9 != 0x130) {
      if (iVar9 == 0x17b) {
        instr = IR::Instr::New(ClearAttributes,this->m_func);
        this_01 = BuildSrcOpnd(this,instance,TyVar);
        this_02 = IR::IntConstOpnd::New((long)propertyId,TyInt32,this->m_func,false);
        if (instr->m_src1 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
          if (!bVar2) goto LAB_004d9f01;
          *puVar7 = 0;
        }
        pFVar8 = instr->m_func;
        if ((this_01->super_Opnd).isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar2) goto LAB_004d9f01;
          *puVar7 = 0;
        }
        bVar3 = (this_01->super_Opnd).field_0xb;
        if ((bVar3 & 2) != 0) {
          this_01 = (RegOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,pFVar8);
          bVar3 = (this_01->super_Opnd).field_0xb;
        }
        (this_01->super_Opnd).field_0xb = bVar3 | 2;
        instr->m_src1 = &this_01->super_Opnd;
        if (instr->m_src2 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
          if (!bVar2) goto LAB_004d9f01;
          *puVar7 = 0;
        }
        pFVar8 = instr->m_func;
        if ((this_02->super_Opnd).isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar2) {
LAB_004d9f01:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar7 = 0;
        }
        bVar3 = (this_02->super_Opnd).field_0xb;
        if ((bVar3 & 2) != 0) {
          this_02 = (IntConstOpnd *)IR::Opnd::Copy(&this_02->super_Opnd,pFVar8);
          bVar3 = (this_02->super_Opnd).field_0xb;
        }
        (this_02->super_Opnd).field_0xb = bVar3 | 2;
        instr->m_src2 = &this_02->super_Opnd;
        goto LAB_004d9ce6;
      }
      if (iVar9 != 0x15c) goto LAB_004d9c58;
      if ((this->m_func->m_localClosureSym->field_0x19 & 0x20) != 0) {
        this_00 = IR::ByteCodeUsesInstr::New(this->m_func,offset);
        IR::ByteCodeUsesInstr::SetNonOpndSymbol
                  (this_00,(this->m_func->m_localClosureSym->super_Sym).m_id);
        AddInstr(this,&this_00->super_Instr,offset);
      }
      pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar4 = JITTimeFunctionBody::GetLocalClosureReg(pJVar5);
      pSVar6 = BuildFieldOpnd(this,LdElemUndef,RVar4,propertyId,propertyIdIndex,PropertyKindData,
                              0xffffffff);
      pFVar8 = this->m_func;
      newOpcode = LdElemUndef;
LAB_004d9c7e:
      instr = IR::Instr::New(newOpcode,&pSVar6->super_Opnd,pFVar8);
      goto LAB_004d9ce6;
    }
    bVar2 = true;
LAB_004d9bf6:
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    RVar4 = JITTimeFunctionBody::GetLocalClosureReg(pJVar5);
    pSVar6 = BuildFieldOpnd(this,DeleteFld,RVar4,propertyId,propertyIdIndex,PropertyKindData,
                            0xffffffff);
    dstOpnd = (SymOpnd *)BuildDstOpnd(this,instance,TyVar,false,bVar2);
    pFVar8 = this->m_func;
    opcode = DeleteFld;
  }
  instr = IR::Instr::New(opcode,&dstOpnd->super_Opnd,&pSVar6->super_Opnd,pFVar8);
LAB_004d9ce6:
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void
IRBuilder::BuildElementU(Js::OpCode newOpcode, uint32 offset, Js::RegSlot instance, Js::PropertyIdIndexType propertyIdIndex)
{
    IR::Instr *     instr;
    IR::RegOpnd *   regOpnd;
    IR::SymOpnd *   fieldSymOpnd;
    Js::PropertyId propertyId = m_func->GetJITFunctionBody()->GetReferencedPropertyId(propertyIdIndex);
    bool            reuseLoc = false;

    switch (newOpcode)
    {
        case Js::OpCode::LdLocalElemUndef:
            if (m_func->GetLocalClosureSym()->HasByteCodeRegSlot())
            {
                IR::ByteCodeUsesInstr * byteCodeUse = IR::ByteCodeUsesInstr::New(m_func, offset);
                byteCodeUse->SetNonOpndSymbol(m_func->GetLocalClosureSym()->m_id);
                this->AddInstr(byteCodeUse, offset);
            }

            instance = m_func->GetJITFunctionBody()->GetLocalClosureReg();
            newOpcode = Js::OpCode::LdElemUndef;
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, propertyIdIndex, PropertyKindData);
            instr = IR::Instr::New(newOpcode, fieldSymOpnd, m_func);
            break;

            // fall through
        case Js::OpCode::LdElemUndefScoped:
        {
             // Store
            PropertyKind propertyKind = PropertyKindData;
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, propertyIdIndex, propertyKind);
            // Implicit root object as default instance
            regOpnd = this->BuildSrcOpnd(Js::FunctionBody::RootObjectRegSlot);

            instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, m_func);
            break;
        }
        case Js::OpCode::ClearAttributes:
        {
            instr = IR::Instr::New(newOpcode, m_func);
            IR::RegOpnd * src1Opnd = this->BuildSrcOpnd(instance);
            IR::IntConstOpnd * src2Opnd = IR::IntConstOpnd::New(propertyId, TyInt32, m_func);

            instr->SetSrc1(src1Opnd);
            instr->SetSrc2(src2Opnd);
            break;
        }

        case Js::OpCode::StLocalFuncExpr:
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, m_func->GetJITFunctionBody()->GetLocalClosureReg(), propertyId, propertyIdIndex, PropertyKindData);
            regOpnd = this->BuildSrcOpnd(instance);
            newOpcode = Js::OpCode::StFuncExpr;
            instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, m_func);
            break;

        case Js::OpCode::DeleteLocalFld_ReuseLoc:
            newOpcode = Js::OpCode::DeleteLocalFld;
            reuseLoc = true;
            // fall through
        case Js::OpCode::DeleteLocalFld:
            newOpcode = Js::OpCode::DeleteFld;
            fieldSymOpnd = BuildFieldOpnd(newOpcode, m_func->GetJITFunctionBody()->GetLocalClosureReg(), propertyId, propertyIdIndex, PropertyKindData);
            regOpnd = BuildDstOpnd(instance, TyVar, false, reuseLoc);
            instr = IR::Instr::New(newOpcode, regOpnd, fieldSymOpnd, m_func);
            break;

        default:
        {
            fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, propertyIdIndex, PropertyKindData);

            instr = IR::Instr::New(newOpcode, fieldSymOpnd, m_func);
            break;
        }
    }

    this->AddInstr(instr, offset);
}